

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void sort_data_update_support(stagewise_poly *poly)

{
  sort_data *psVar1;
  long lVar2;
  float fVar3;
  example *peVar4;
  uint64_t uVar5;
  sort_data *psVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  undefined4 uVar9;
  float *pfVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  uint32_t *puVar14;
  long lVar15;
  long lVar16;
  vw *pvVar17;
  long lVar18;
  sort_data *psVar19;
  uint64_t *puVar20;
  long lVar21;
  sort_data *psVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  
  peVar4 = poly->original_ec;
  uVar5 = (peVar4->super_example_predict).ft_offset;
  lVar21 = 0;
  (poly->synth_ec).super_example_predict.ft_offset = 0;
  (peVar4->super_example_predict).ft_offset = 0;
  fVar25 = powf((float)poly->sum_input_sparsity / (float)poly->num_examples,poly->sched_exponent);
  uVar23 = 1L << ((byte)poly->all->num_bits & 0x3f);
  uVar13 = (long)(fVar25 - 9.223372e+18) & (long)fVar25 >> 0x3f | (long)fVar25;
  if (uVar13 <= uVar23) {
    uVar23 = uVar13;
  }
  sort_data_ensure_sz(poly,uVar23);
  pvVar17 = poly->all;
  psVar22 = poly->sd;
  do {
    bVar24 = (pvVar17->weights).sparse;
    puVar14 = &(pvVar17->weights).dense_weights._stride_shift;
    if (bVar24 != false) {
      puVar14 = &(pvVar17->weights).sparse_weights._stride_shift;
    }
    puVar20 = &(pvVar17->weights).dense_weights._weight_mask;
    if (bVar24 != false) {
      puVar20 = &(pvVar17->weights).sparse_weights._weight_mask;
    }
    bVar12 = (byte)*puVar14;
    uVar13 = lVar21 << (bVar12 & 0x3f);
    if (((poly->depthsbits
          [(((poly->synth_ec).super_example_predict.ft_offset + uVar13 & *puVar20) >>
           (bVar12 & 0x3f)) * 2 + 1] & 1) == 0) &&
       (uVar13 != ((ulong)pvVar17->wpp * 0xb1c55c << (bVar12 & 0x3f) & *puVar20))) {
      if (bVar24 == false) {
        pfVar10 = (pvVar17->weights).dense_weights._begin +
                  ((pvVar17->weights).dense_weights._weight_mask & uVar13);
      }
      else {
        pfVar10 = sparse_parameters::operator[](&(pvVar17->weights).sparse_weights,uVar13);
      }
      fVar25 = *pfVar10;
      pvVar17 = poly->all;
      uVar11 = pvVar17->normalized_idx + uVar13;
      if ((pvVar17->weights).sparse == true) {
        pfVar10 = sparse_parameters::operator[](&(pvVar17->weights).sparse_weights,uVar11);
      }
      else {
        pfVar10 = (pvVar17->weights).dense_weights._begin +
                  (uVar11 & (pvVar17->weights).dense_weights._weight_mask);
      }
      fVar25 = ABS(fVar25) * *pfVar10;
      if (1e-09 < fVar25) {
        psVar6 = poly->sd;
        if (((long)psVar22 - (long)psVar6 >> 4 == (long)(int)uVar23) &&
           (psVar6->weightsal <= fVar25 && fVar25 != psVar6->weightsal)) {
          if (0x10 < (long)psVar22 - (long)psVar6) {
            fVar3 = psVar22[-1].weightsal;
            uVar7 = psVar22[-1].wid;
            uVar9 = *(undefined4 *)&psVar6->field_0x4;
            uVar8 = psVar6->wid;
            psVar22[-1].weightsal = psVar6->weightsal;
            *(undefined4 *)&psVar22[-1].field_0x4 = uVar9;
            psVar22[-1].wid = uVar8;
            uVar11 = (long)psVar22 + (-0x10 - (long)psVar6);
            lVar18 = (long)uVar11 >> 4;
            if (lVar18 < 3) {
              lVar16 = 0;
            }
            else {
              lVar15 = 0;
              do {
                lVar16 = lVar15 * 2 + 2;
                lVar2 = lVar15 * 2 + 1;
                if (psVar6[lVar2].weightsal <= psVar6[lVar16].weightsal &&
                    psVar6[lVar16].weightsal != psVar6[lVar2].weightsal) {
                  lVar16 = lVar2;
                }
                psVar1 = psVar6 + lVar16;
                uVar9 = *(undefined4 *)&psVar1->field_0x4;
                uVar8 = psVar1->wid;
                psVar19 = psVar6 + lVar15;
                psVar19->weightsal = psVar1->weightsal;
                *(undefined4 *)&psVar19->field_0x4 = uVar9;
                psVar19->wid = uVar8;
                lVar15 = lVar16;
              } while (lVar16 < (lVar18 - (lVar18 + -1 >> 0x3f)) + -1 >> 1);
            }
            lVar15 = lVar16;
            if (((uVar11 & 0x10) == 0) && (lVar16 == lVar18 + -2 >> 1)) {
              lVar15 = lVar16 * 2 + 1;
              psVar1 = psVar6 + lVar15;
              uVar9 = *(undefined4 *)&psVar1->field_0x4;
              uVar8 = psVar1->wid;
              psVar19 = psVar6 + lVar16;
              psVar19->weightsal = psVar1->weightsal;
              *(undefined4 *)&psVar19->field_0x4 = uVar9;
              psVar19->wid = uVar8;
            }
            if (0 < lVar15) {
              do {
                lVar18 = (lVar15 - (lVar15 + -1 >> 0x3f)) + -1 >> 1;
                if (psVar6[lVar18].weightsal <= fVar3) break;
                psVar19 = psVar6 + lVar18;
                uVar9 = *(undefined4 *)&psVar19->field_0x4;
                uVar8 = psVar19->wid;
                psVar1 = psVar6 + lVar15;
                psVar1->weightsal = psVar19->weightsal;
                *(undefined4 *)&psVar1->field_0x4 = uVar9;
                psVar1->wid = uVar8;
                bVar24 = 2 < lVar15;
                lVar15 = lVar18;
              } while (bVar24);
            }
            psVar6[lVar15].weightsal = fVar3;
            psVar6[lVar15].wid = uVar7;
          }
          psVar22 = psVar22 + -1;
        }
        if ((long)psVar22 - (long)poly->sd >> 4 < (long)(int)uVar23) {
          psVar22->weightsal = fVar25;
          psVar22->wid = uVar13;
          psVar22 = psVar22 + 1;
          psVar6 = poly->sd;
          lVar16 = (long)psVar22 - (long)psVar6 >> 4;
          lVar18 = lVar16 + -1;
          if (1 < lVar16) {
            do {
              lVar16 = (lVar18 - (lVar18 + -1 >> 0x3f)) + -1 >> 1;
              if (psVar6[lVar16].weightsal <= fVar25) break;
              psVar19 = psVar6 + lVar16;
              uVar9 = *(undefined4 *)&psVar19->field_0x4;
              uVar7 = psVar19->wid;
              psVar1 = psVar6 + lVar18;
              psVar1->weightsal = psVar19->weightsal;
              *(undefined4 *)&psVar1->field_0x4 = uVar9;
              psVar1->wid = uVar7;
              bVar24 = 2 < lVar18;
              lVar18 = lVar16;
            } while (bVar24);
          }
          psVar6[lVar18].weightsal = fVar25;
          psVar6[lVar18].wid = uVar13;
        }
      }
    }
    lVar21 = lVar21 + 1;
    pvVar17 = poly->all;
  } while (lVar21 != 1L << ((byte)pvVar17->num_bits & 0x3f));
  lVar21 = (long)psVar22 - (long)poly->sd;
  if ((lVar21 != 0) && (poly->sd_len != 0)) {
    lVar18 = 8;
    uVar23 = 1;
    do {
      pvVar17 = poly->all;
      puVar14 = &(pvVar17->weights).dense_weights._stride_shift;
      puVar20 = &(pvVar17->weights).dense_weights._weight_mask;
      if ((pvVar17->weights).sparse != false) {
        puVar14 = &(pvVar17->weights).sparse_weights._stride_shift;
        puVar20 = &(pvVar17->weights).sparse_weights._weight_mask;
      }
      poly->depthsbits
      [(((poly->synth_ec).super_example_predict.ft_offset +
         *(long *)((long)&poly->sd->weightsal + lVar18) & *puVar20) >> ((byte)*puVar14 & 0x3f)) * 2
       + 1] = poly->depthsbits
              [(((poly->synth_ec).super_example_predict.ft_offset +
                 *(long *)((long)&poly->sd->weightsal + lVar18) & *puVar20) >>
               ((byte)*puVar14 & 0x3f)) * 2 + 1] ^ 1;
      if ((ulong)(lVar21 >> 4) <= uVar23) break;
      lVar18 = lVar18 + 0x10;
      bVar24 = uVar23 < poly->sd_len;
      uVar23 = uVar23 + 1;
    } while (bVar24);
  }
  (poly->original_ec->super_example_predict).ft_offset = uVar5;
  (poly->synth_ec).super_example_predict.ft_offset = uVar5;
  return;
}

Assistant:

void sort_data_update_support(stagewise_poly &poly)
{
  assert(poly.num_examples);

  // ft_offset affects parent_set / parent_get.  This state must be reset at end.
  uint64_t pop_ft_offset = poly.original_ec->ft_offset;
  poly.synth_ec.ft_offset = 0;
  assert(poly.original_ec);
  poly.original_ec->ft_offset = 0;

  size_t num_new_features = (size_t)pow(poly.sum_input_sparsity * 1.0f / poly.num_examples, poly.sched_exponent);
  num_new_features = (num_new_features > poly.all->length()) ? (uint64_t)poly.all->length() : num_new_features;
  sort_data_ensure_sz(poly, num_new_features);

  sort_data *heap_end = poly.sd;
  make_heap(poly.sd, heap_end, sort_data_compar_heap);  // redundant
  for (uint64_t i = 0; i != poly.all->length(); ++i)
  {
    uint64_t wid = stride_shift(poly, i);
    if (!parent_get(poly, wid) && wid != constant_feat_masked(poly))
    {
      float weightsal = (fabsf(poly.all->weights[wid]) * poly.all->weights[poly.all->normalized_idx + (wid)]);
      /*
       * here's some depth penalization code.  It was found to not improve
       * statistical performance, and meanwhile it is verified as giving
       * a nontrivial computational hit, thus commented out.
       *
       * - poly.magic_argument
       * sqrtf(min_depths_get(poly, stride_shift(poly, i)) * 1.0 / poly.num_examples)
       */
      ;
      if (weightsal > tolerance)
      {
        assert(heap_end >= poly.sd);
        assert(heap_end <= poly.sd + num_new_features);

        if (heap_end - poly.sd == (int)num_new_features && poly.sd->weightsal < weightsal)
        {
          pop_heap(poly.sd, heap_end, sort_data_compar_heap);
          --heap_end;
        }

        assert(heap_end >= poly.sd);
        assert(heap_end < poly.sd + poly.sd_len);

        if (heap_end - poly.sd < (int)num_new_features)
        {
          heap_end->weightsal = weightsal;
          heap_end->wid = wid;
          ++heap_end;
          push_heap(poly.sd, heap_end, sort_data_compar_heap);
        }
      }
    }
  }
  num_new_features = (uint64_t)(heap_end - poly.sd);

#ifdef DEBUG
  // eyeballing weights a pain if unsorted.
  qsort(poly.sd, num_new_features, sizeof(sort_data), sort_data_compar);
#endif  // DEBUG

  for (uint64_t pos = 0; pos < num_new_features && pos < poly.sd_len; ++pos)
  {
    assert(!parent_get(poly, poly.sd[pos].wid) && poly.sd[pos].weightsal > tolerance &&
        poly.sd[pos].wid != constant_feat_masked(poly));
    parent_toggle(poly, poly.sd[pos].wid);
#ifdef DEBUG
    cout << "Adding feature " << pos << "/" << num_new_features << " || wid " << poly.sd[pos].wid << " || sort value "
         << poly.sd[pos].weightsal << endl;
#endif  // DEBUG
  }

#ifdef DEBUG
  cout << "depths:";
  for (uint64_t depth = 0; depth <= poly.max_depth && depth < sizeof(poly.depths) / sizeof(*poly.depths); ++depth)
    cout << "  [" << depth << "] = " << poly.depths[depth];
  cout << endl;

  cout << "Sanity check after sort... " << flush;
  sanity_check_state(poly);
  cout << "done" << endl;
#endif  // DEBUG

  // it's okay that these may have been initially unequal; synth_ec value irrelevant so far.
  poly.original_ec->ft_offset = pop_ft_offset;
  poly.synth_ec.ft_offset = pop_ft_offset;
}